

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CGL::Application::mouse_event(Application *this,int key,int event,uchar mods)

{
  if (event == 0) {
    if (key == 2) {
      this->middleDown = false;
    }
    else {
      if (key == 1) {
        mouse_released(this,RIGHT);
        return;
      }
      if (key == 0) {
        mouse_released(this,LEFT);
        return;
      }
    }
  }
  else if (event == 1) {
    if (key == 2) {
      this->middleDown = true;
      return;
    }
    if (key == 1) {
      this->rightDown = true;
      return;
    }
    if (key == 0) {
      mouse_pressed(this,LEFT);
      return;
    }
  }
  return;
}

Assistant:

void Application::mouse_event(int key, int event, unsigned char mods) {
  switch(event) {
    case EVENT_PRESS:
      switch(key) {
        case MOUSE_LEFT:
          mouse_pressed(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_pressed(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_pressed(MIDDLE);
          break;
      }
      break;
    case EVENT_RELEASE:
      switch(key) {
        case MOUSE_LEFT:
          mouse_released(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_released(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_released(MIDDLE);
          break;
      }
      break;
  }
}